

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O2

bool __thiscall juzzlin::SimpleLogger::Impl::shouldFlush(Impl *this)

{
  bool bVar1;
  string local_30 [8];
  long local_28;
  
  if ((int)this->m_activeLevel < m_level) {
    bVar1 = false;
  }
  else {
    std::__cxx11::stringbuf::str();
    bVar1 = local_28 != 0;
    std::__cxx11::string::~string(local_30);
  }
  return bVar1;
}

Assistant:

bool SimpleLogger::Impl::shouldFlush() const
{
    return m_activeLevel >= m_level && !m_message.str().empty();
}